

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O1

void lj_state_growstack(lua_State *L,MSize need)

{
  uint uVar1;
  MSize n;
  
  uVar1 = L->stacksize;
  if (0xffe4 < uVar1) {
    if (uVar1 != 0xffe5) {
      lj_err_throw(L,5);
    }
    if (L->status < 2) {
      L->status = '\x02';
      lj_err_msg(L,LJ_ERR_STKOV);
    }
  }
  n = need + uVar1;
  if (n < 0xffdd) {
    uVar1 = uVar1 * 2;
    if ((n < uVar1) && (n = 0xffdc, uVar1 < 0xffdc)) {
      n = uVar1;
    }
  }
  else {
    n = n + 0x28;
  }
  resizestack(L,n);
  return;
}

Assistant:

void LJ_FASTCALL lj_state_growstack(lua_State *L, MSize need)
{
  MSize n;
  if (L->stacksize >= LJ_STACK_MAXEX) {
    /* 4. Throw 'error in error handling' when we are _over_ the limit. */
    if (L->stacksize > LJ_STACK_MAXEX)
      lj_err_throw(L, LUA_ERRERR);  /* Does not invoke an error handler. */
    /* 1. We are _at_ the limit after the last growth. */
    if (L->status < LUA_ERRRUN) {  /* 2. Throw 'stack overflow'. */
      L->status = LUA_ERRRUN;  /* Prevent ending here again for pushed msg. */
      lj_err_msg(L, LJ_ERR_STKOV);  /* May invoke an error handler. */
    }
    /* 3. Add space (over the limit) for pushed message and error handler. */
  }
  n = L->stacksize + need;
  if (n > LJ_STACK_MAX) {
    n += 2*LUA_MINSTACK;
  } else if (n < 2*L->stacksize) {
    n = 2*L->stacksize;
    if (n >= LJ_STACK_MAX)
      n = LJ_STACK_MAX;
  }
  resizestack(L, n);
}